

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_get_body_type(MESSAGE_HANDLE message,MESSAGE_BODY_TYPE *body_type)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  MESSAGE_BODY_TYPE *body_type_local;
  MESSAGE_HANDLE message_local;
  
  if ((message == (MESSAGE_HANDLE)0x0) || (body_type == (MESSAGE_BODY_TYPE *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_get_body_type",0x58e,1,"Bad arguments: message = %p, body_type = %p",
                message,body_type);
    }
    l._4_4_ = 0x58f;
  }
  else {
    if (message->body_amqp_value == (AMQP_VALUE)0x0) {
      if (message->body_amqp_data_count == 0) {
        if (message->body_amqp_sequence_count == 0) {
          *body_type = MESSAGE_BODY_TYPE_NONE;
        }
        else {
          *body_type = MESSAGE_BODY_TYPE_SEQUENCE;
        }
      }
      else {
        *body_type = MESSAGE_BODY_TYPE_DATA;
      }
    }
    else {
      *body_type = MESSAGE_BODY_TYPE_VALUE;
    }
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int message_get_body_type(MESSAGE_HANDLE message, MESSAGE_BODY_TYPE* body_type)
{
    int result;

    if ((message == NULL) ||
        (body_type == NULL))
    {
        /* Codes_SRS_MESSAGE_01_127: [ If `message` or `body_type` is NULL, `message_get_body_type` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, body_type = %p",
            message, body_type);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_125: [ `message_get_body_type` shall fill in `body_type` the AMQP message body type. ]*/
        if (message->body_amqp_value != NULL)
        {
            *body_type = MESSAGE_BODY_TYPE_VALUE;
        }
        else if (message->body_amqp_data_count > 0)
        {
            *body_type = MESSAGE_BODY_TYPE_DATA;
        }
        else if (message->body_amqp_sequence_count > 0)
        {
            *body_type = MESSAGE_BODY_TYPE_SEQUENCE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_128: [ If no body has been set on the message, `body_type` shall be `MESSAGE_BODY_TYPE_NONE`. ]*/
            *body_type = MESSAGE_BODY_TYPE_NONE;
        }

        /* Codes_SRS_MESSAGE_01_126: [ On success, `message_get_body_type` shall return 0. ]*/
        result = 0;
    }

    return result;
}